

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

const_iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
end(StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_> *this)

{
  long in_RSI;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> *in_RDI;
  Translator **ptr;
  Translator **ptr_1;
  Translator **local_38;
  Translator **local_18;
  Translator **local_10 [2];
  
  if (*(int *)(in_RSI + 0x18) == 0x20) {
    if (*(long *)(in_RSI + 8) == 0) {
      local_38 = &end::emptyValue;
    }
    else {
      local_38 = (Translator **)(*(long *)(in_RSI + 8) + (long)(*(int *)(in_RSI + 0x14) + 1) * 8);
    }
    local_10[0] = local_38;
    BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*>::BlockIterator
              (in_RDI,local_10,0);
  }
  else {
    local_18 = (Translator **)(*(long *)(in_RSI + 8) + (long)*(int *)(in_RSI + 0x14) * 8);
    BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*>::BlockIterator
              (in_RDI,&local_18,*(int *)(in_RSI + 0x18));
  }
  return in_RDI;
}

Assistant:

const_iterator end() const
        {
            static const X* const emptyValue{nullptr};
            if (bsize == blockSize) {
                const X* const* ptr = (dataptr != nullptr) ?
                    &(dataptr[dataSlotIndex + 1]) :
                    &emptyValue;
                return {ptr, 0};
            }
            const X* const* ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }